

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O0

ProString * __thiscall
MingwMakefileGenerator::fixLibFlag(MingwMakefileGenerator *this,ProString *lib)

{
  bool bVar1;
  ProString *in_RDX;
  QStringBuilder<QLatin1String,_ProString> *in_RSI;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  MakefileGenerator *b;
  QStringBuilder<QLatin1String,_ProString> *this_00;
  MakefileGenerator *this_01;
  undefined1 local_230 [24];
  undefined1 local_218 [72];
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [152];
  undefined1 local_120 [24];
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b = in_RDI;
  this_00 = in_RSI;
  this_01 = in_RDI;
  bVar1 = ProString::startsWith(in_RDX,(char *)in_RSI,(CaseSensitivity)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    QLatin1String::QLatin1String((QLatin1String *)in_RDX,(char *)in_RSI);
    ProString::mid((ProString *)this_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    MakefileGenerator::escapeFilePath(this_01,(ProString *)this_00);
    ::operator+(&in_RSI->a,(ProString *)b);
    ProString::ProString<QLatin1String,ProString>(in_RDX,in_RSI);
    QStringBuilder<QLatin1String,_ProString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_ProString> *)0x231d95);
    ProString::~ProString((ProString *)0x231da2);
    ProString::~ProString((ProString *)0x231daf);
  }
  else {
    bVar1 = ProString::startsWith(in_RDX,(char *)in_RSI,(CaseSensitivity)((ulong)b >> 0x20));
    if (bVar1) {
      QLatin1String::QLatin1String((QLatin1String *)in_RDX,(char *)in_RSI);
      ProString::mid((ProString *)this_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      ProString::toQString((ProString *)in_RDI);
      Option::fixPathToTargetOS
                ((QString *)this_00,SUB81((ulong)in_RDX >> 0x38,0),SUB81((ulong)in_RDX >> 0x30,0));
      (**(code **)((in_RSI->a).m_size + 0x60))(local_108,in_RSI,local_120);
      ::operator+(&in_RSI->a,(QString *)b);
      ProString::ProString<QLatin1String,QString>
                (in_RDX,(QStringBuilder<QLatin1String,_QString> *)in_RSI);
      QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                ((QStringBuilder<QLatin1String,_QString> *)0x231e8a);
      QString::~QString((QString *)0x231e97);
      QString::~QString((QString *)0x231ea4);
      QString::~QString((QString *)0x231eb1);
      ProString::~ProString((ProString *)0x231ebe);
    }
    else {
      bVar1 = ProString::startsWith(in_RDX,(char *)in_RSI,(CaseSensitivity)((ulong)b >> 0x20));
      if (bVar1) {
        QLatin1String::QLatin1String((QLatin1String *)in_RDX,(char *)in_RSI);
        ProString::mid((ProString *)this_00,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
        ProString::toQString((ProString *)in_RDI);
        (**(code **)((in_RSI->a).m_size + 0x60))(local_1b8,in_RSI,local_1d0);
        ::operator+(&in_RSI->a,(QString *)b);
        ProString::ProString<QLatin1String,QString>
                  (in_RDX,(QStringBuilder<QLatin1String,_QString> *)in_RSI);
        QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                  ((QStringBuilder<QLatin1String,_QString> *)0x231f77);
        QString::~QString((QString *)0x231f84);
        QString::~QString((QString *)0x231f91);
        ProString::~ProString((ProString *)0x231f9b);
      }
      else {
        ProString::toQString((ProString *)in_RDI);
        Option::fixPathToTargetOS
                  ((QString *)this_00,SUB81((ulong)in_RDX >> 0x38,0),SUB81((ulong)in_RDX >> 0x30,0))
        ;
        (**(code **)((in_RSI->a).m_size + 0x60))(local_218,in_RSI,local_230);
        ProString::ProString((ProString *)b,(QString *)in_RDI);
        QString::~QString((QString *)0x231fef);
        QString::~QString((QString *)0x231ff9);
        QString::~QString((QString *)0x232003);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ProString *)b;
  }
  __stack_chk_fail();
}

Assistant:

ProString MingwMakefileGenerator::fixLibFlag(const ProString &lib)
{
    if (lib.startsWith("-l"))  // Fallback for unresolved -l libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(2));
    if (lib.startsWith("-L"))  // Lib search path. Needed only by -l above.
        return QLatin1String("-L")
                + escapeFilePath(Option::fixPathToTargetOS(lib.mid(2).toQString(), false));
    if (lib.startsWith("lib"))  // Fallback for unresolved MSVC-style libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(3).toQString());
    return escapeFilePath(Option::fixPathToTargetOS(lib.toQString(), false));
}